

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::CharSet<unsigned_int>::GetNextRange
          (CharSet<unsigned_int> *this,Char searchCharStart,Char *outLowerChar,Char *outHigherChar)

{
  code *pcVar1;
  Char c;
  bool bVar2;
  Char CVar3;
  int iVar4;
  Char CVar5;
  Char CVar6;
  undefined4 *puVar7;
  CharSet<char16_t> *pCVar8;
  long lVar9;
  int iVar10;
  int index;
  undefined4 *local_58;
  Char local_34;
  Char local_32 [3];
  char16 currentHighChar;
  char16 currentLowChar;
  
  if (outLowerChar == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x675,"(outLowerChar != nullptr)","outLowerChar != nullptr");
    if (!bVar2) goto LAB_00cda6af;
    *puVar7 = 0;
  }
  if (outHigherChar == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x676,"(outHigherChar != nullptr)","outHigherChar != nullptr");
    if (!bVar2) goto LAB_00cda6af;
    *puVar7 = 0;
  }
  iVar10 = 0;
  if (searchCharStart < 0x110000) {
    local_32[0] = L'\x01';
    local_34 = L'\0';
    iVar4 = CharToIndex(this,searchCharStart);
    CVar3 = RemoveOffset(this,searchCharStart);
    lVar9 = (long)iVar4;
    pCVar8 = this->characterPlanes + lVar9;
    for (; lVar9 < 0x11; lVar9 = lVar9 + 1) {
      bVar2 = CharSet<char16_t>::GetNextRange(pCVar8,CVar3,local_32,&local_34);
      if (bVar2) goto LAB_00cda523;
      iVar10 = iVar10 + -1;
      pCVar8 = pCVar8 + 1;
      CVar3 = L'\0';
    }
    if (lVar9 == 0x11) {
      iVar10 = 0;
    }
    else {
LAB_00cda523:
      c = local_32[0];
      CVar3 = local_34;
      if ((ushort)local_34 < (ushort)local_32[0]) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        local_58 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_58 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                           ,0x68d,"(currentHighChar >= currentLowChar)",
                           "currentHighChar >= currentLowChar");
        if (!bVar2) {
LAB_00cda6af:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *local_58 = 0;
      }
      else {
        local_58 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      index = (iVar4 + 1) - iVar10;
      CVar5 = AddOffset(this,c,iVar4 - iVar10);
      *outLowerChar = CVar5;
      CVar5 = AddOffset(this,CVar3,iVar4 - iVar10);
      pCVar8 = this->characterPlanes + index;
      while( true ) {
        *outHigherChar = CVar5;
        iVar10 = 1;
        if (((0x10 < index) ||
            (bVar2 = CharSet<char16_t>::GetNextRange(pCVar8,L'\0',local_32,&local_34), !bVar2)) ||
           (CVar5 = *outHigherChar, CVar6 = AddOffset(this,local_32[0],index), CVar3 = local_34,
           CVar5 + 1 != CVar6)) break;
        CVar5 = AddOffset(this,local_34,index);
        if (CVar5 <= *outHigherChar) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_58 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                             ,0x69a,"(this->AddOffset(currentHighChar, index) > *outHigherChar)",
                             "this->AddOffset(currentHighChar, index) > *outHigherChar");
          if (!bVar2) goto LAB_00cda6af;
          *local_58 = 0;
        }
        CVar5 = AddOffset(this,CVar3,index);
        index = index + 1;
        pCVar8 = pCVar8 + 1;
      }
    }
  }
  return SUB41(iVar10,0);
}

Assistant:

bool CharSet<codepoint_t>::GetNextRange(Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar)
    {
        Assert(outLowerChar != nullptr);
        Assert(outHigherChar != nullptr);
        if (searchCharStart >= 0x110000)
        {
            return false;
        }

        char16 currentLowChar = 1, currentHighChar = 0;
        int index = this->CharToIndex(searchCharStart);
        char16 offsetLessSearchCharStart = this->RemoveOffset(searchCharStart);

        for (; index < NumberOfPlanes; index++)
        {
            if (this->characterPlanes[index].GetNextRange(offsetLessSearchCharStart, &currentLowChar, &currentHighChar))
            {
                break;
            }
            offsetLessSearchCharStart = 0x0;
        }

        if (index == NumberOfPlanes)
        {
            return false;
        }
        Assert(currentHighChar >= currentLowChar);
        // else found range
        *outLowerChar = this->AddOffset(currentLowChar, index);
        *outHigherChar = this->AddOffset(currentHighChar, index);

        // Check if range crosses plane boundaries
        index ++;
        for (; index < NumberOfPlanes; index++)
        {
            if (!this->characterPlanes[index].GetNextRange(0x0, &currentLowChar, &currentHighChar) || *outHigherChar + 1 != this->AddOffset(currentLowChar, index))
            {
                break;
            }
            Assert(this->AddOffset(currentHighChar, index) > *outHigherChar);
            *outHigherChar = this->AddOffset(currentHighChar, index);
        }

        return true;
    }